

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_dungeon(void)

{
  chunk_conflict *c;
  player *p;
  wchar_t wVar1;
  char *pcVar2;
  loc grid;
  ushort local_12;
  ushort local_10;
  ushort local_e;
  wchar_t wStack_c;
  uint16_t px;
  uint16_t py;
  uint16_t depth;
  
  rd_u16b(&local_e);
  rd_u16b(&daycount);
  rd_u16b(&local_10);
  rd_u16b(&local_12);
  rd_byte(&square_size);
  if ((player->is_dead & 1U) == 0) {
    if (local_e < z_info->max_depth) {
      wVar1 = rd_dungeon_aux((chunk **)&cave);
      if (wVar1 == L'\0') {
        if (((int)(uint)local_12 < cave->width) && ((int)(uint)local_10 < cave->height)) {
          player->depth = local_e;
          cave->depth = (uint)local_e;
          p = player;
          c = cave;
          grid = loc((uint)local_12,(uint)local_10);
          player_place((chunk_conflict1 *)c,p,grid);
          character_dungeon = true;
          wVar1 = rd_dungeon_aux((chunk **)&player->cave);
          if (wVar1 == L'\0') {
            player->cave->depth = (uint)local_e;
            wStack_c = L'\0';
          }
          else {
            wStack_c = L'\x01';
          }
        }
        else {
          pcVar2 = format("Ignoring illegal player location (%d,%d).",(ulong)local_10,
                          (ulong)local_12);
          note(pcVar2);
          wStack_c = L'\x01';
        }
      }
      else {
        wStack_c = L'\x01';
      }
    }
    else {
      pcVar2 = format("Ignoring illegal dungeon depth (%d)",(ulong)local_e);
      note(pcVar2);
      wStack_c = L'\0';
    }
  }
  else {
    wStack_c = L'\0';
  }
  return wStack_c;
}

Assistant:

int rd_dungeon(void)
{
	uint16_t depth;
	uint16_t py, px;

	/* Header info */
	rd_u16b(&depth);
	rd_u16b(&daycount);
	rd_u16b(&py);
	rd_u16b(&px);
	rd_byte(&square_size);

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	/* Ignore illegal dungeons */
	if (depth >= z_info->max_depth) {
		note(format("Ignoring illegal dungeon depth (%d)", depth));
		return (0);
	}

	if (rd_dungeon_aux(&cave))
		return 1;

	/* Ignore illegal dungeons */
	if ((px >= cave->width) || (py >= cave->height)) {
		note(format("Ignoring illegal player location (%d,%d).", py, px));
		return (1);
	}

	/* Load player depth */
	player->depth = depth;
	cave->depth = depth;

	/* Place player in dungeon */
	player_place(cave, player, loc(px, py));

	/* The dungeon is ready */
	character_dungeon = true;

	/* Read known cave */
	if (rd_dungeon_aux(&player->cave)) {
		return 1;
	}
	player->cave->depth = depth;

	return 0;
}